

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall DetectorSS::Update(DetectorSS *this,key_tp src,key_tp dst,val_tp weight)

{
  uint64_t uVar1;
  undefined4 in_EDX;
  key_tp in_ESI;
  DetectorSS *in_RDI;
  void *unaff_retaddr;
  int i_1;
  int i;
  int pos;
  uint32_t hashval [4];
  uint32_t key [3];
  uint bucket;
  unsigned_long p;
  int tmplevel;
  unsigned_long edge;
  int local_64;
  int local_60;
  int local_5c;
  uint local_58 [9];
  uint local_34;
  uint64_t local_30;
  int local_24;
  undefined1 local_20 [16];
  DetectorSS *pDVar2;
  
  local_24 = 0;
  pDVar2 = in_RDI;
  local_30 = MurmurHash64A(local_20,(in_RDI->ss_).lgn / 8 << 1,*(in_RDI->ss_).hash);
  local_24 = loghash(in_RDI,local_30);
  local_34 = 0;
  memset(local_58,0,0x10);
  MurmurHash3_x64_128(unaff_retaddr,(int)((ulong)pDVar2 >> 0x20),(uint32_t)pDVar2,
                      (void *)CONCAT44(in_ESI,in_EDX));
  if (local_24 < (in_RDI->ss_).c + -1) {
    local_5c = (in_RDI->ss_).offsets[local_24] +
               (int)((local_30 & 0xffffffff) * (long)(in_RDI->ss_).b >> 0x20);
  }
  else {
    local_5c = (in_RDI->ss_).offsets[(in_RDI->ss_).c + -1] +
               (int)((local_30 & 0xffffffff) * (long)(in_RDI->ss_).lastb >> 0x20);
  }
  for (local_60 = 0; local_60 < (in_RDI->ss_).tdepth; local_60 = local_60 + 1) {
    local_34 = (uint)((ulong)local_58[local_60] * (long)(in_RDI->ss_).width >> 0x20);
    if ((in_RDI->ss_).level[local_60][local_34] < local_24) {
      (in_RDI->ss_).level[local_60][local_34] = local_24;
      (in_RDI->ss_).skey[local_60][local_34] = in_ESI;
    }
    Setbit(in_RDI,local_5c,local_34,(in_RDI->ss_).counts[local_60]);
  }
  for (local_64 = 4; local_64 < (in_RDI->ss_).depth; local_64 = local_64 + 1) {
    uVar1 = MurmurHash64A(&stack0xfffffffffffffff4,(in_RDI->ss_).lgn / 8,
                          (in_RDI->ss_).hash[local_64]);
    local_34 = (uint)((uVar1 & 0xffffffff) * (long)(in_RDI->ss_).width >> 0x20);
    if ((in_RDI->ss_).level[local_64][local_34] < local_24) {
      (in_RDI->ss_).level[local_64][local_34] = local_24;
      (in_RDI->ss_).skey[local_64][local_34] = in_ESI;
    }
    Setbit(in_RDI,local_5c,local_34,(in_RDI->ss_).counts[local_64]);
  }
  return;
}

Assistant:

void DetectorSS::Update(key_tp src, key_tp dst, val_tp weight) {
	unsigned long edge = src;
	edge = (edge << 32) | dst;
	int tmplevel = 0;
	//Update sketch
	unsigned long p = MurmurHash64A((unsigned char*)(&edge), ss_.lgn / 8 * 2, ss_.hash[0]);
#ifdef HH
	//check if HH
	int index = p & ss_.mask;
	if (ss_.key[index] == edge) {
		ss_.indicator[index]++;
		return;
	}
	else {
		ss_.indicator[index]--;
		if (ss_.indicator[index] < 0) {
			ss_.key[index] = edge;
			ss_.indicator[index] = 1;
		}
	}
#endif
	tmplevel = loghash(p);
	unsigned bucket = 0;
	uint32_t key[3] = { src, src, src };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)key, 12, ss_.hash[0], (unsigned char*)hashval);
	int pos = 0;
	if (tmplevel < ss_.c - 1) {
		pos = (((uint32_t)p * ((uint64_t)ss_.b)) >> 32);
		pos += ss_.offsets[tmplevel];
	}
	else {
		pos = (((uint32_t)p * (uint64_t)ss_.lastb) >> 32);
		pos += ss_.offsets[ss_.c - 1];
	}

	for (int i = 0; i < ss_.tdepth; i++) {
		bucket = (hashval[i] * (unsigned long)ss_.width) >> 32;
		if (ss_.level[i][bucket] < tmplevel) {
			ss_.level[i][bucket] = tmplevel;
			ss_.skey[i][bucket] = src;
		}
		//Update distinct counter
		Setbit(pos, bucket, ss_.counts[i]);
	}

	for (int i = 4; i < ss_.depth; i++) {
		bucket = MurmurHash64A((unsigned char*)(&src), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		if (ss_.level[i][bucket] < tmplevel) {
			ss_.level[i][bucket] = tmplevel;
			ss_.skey[i][bucket] = src;
		}
		Setbit(pos, bucket, ss_.counts[i]);
	}
}